

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpsrv.cpp
# Opt level: O1

vm_httpsrv_ext * vm_httpsrv_ext::alloc_ext(CVmObjHTTPServer *self)

{
  int iVar1;
  undefined4 extraout_var;
  vm_httpsrv_ext *pvVar2;
  
  iVar1 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])(G_mem_X->varheap_,0x10,self);
  pvVar2 = (vm_httpsrv_ext *)CONCAT44(extraout_var,iVar1);
  pvVar2->l = (TadsListener *)0x0;
  pvVar2->addr = (char *)0x0;
  return pvVar2;
}

Assistant:

vm_httpsrv_ext *vm_httpsrv_ext::alloc_ext(
    VMG_ CVmObjHTTPServer *self)
{
    /* calculate how much space we need */
    size_t siz = sizeof(vm_httpsrv_ext);

    /* allocate the memory */
    vm_httpsrv_ext *ext = (vm_httpsrv_ext *)
                          G_mem->get_var_heap()->alloc_mem(siz, self);

    /* we don't have a listener or binding address yet */
    ext->l = 0;
    ext->addr = 0;

    /* return the new extension */
    return ext;
}